

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = 0;
  do {
    if (*(int *)this <= (int)uVar6 >> 5) {
LAB_00140b02:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                    ,0x4e7,
                    "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]");
    }
    uVar8 = uVar6;
    if ((*(uint *)(*(long *)(this + 8) + (long)((int)uVar6 >> 5) * 4) >> (uVar6 & 0x1f) & 1) != 0) {
      iVar1 = out_ranges->Capacity;
      if (out_ranges->Size == iVar1) {
        if (iVar1 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar1 / 2 + iVar1;
        }
        iVar4 = out_ranges->Size + 1;
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        if (iVar1 < iVar4) {
          puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar4 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar2;
          out_ranges->Capacity = iVar4;
        }
      }
      out_ranges->Data[out_ranges->Size] = (unsigned_short)uVar6;
      iVar3 = out_ranges->Size;
      iVar1 = iVar3 + 1;
      out_ranges->Size = iVar1;
      uVar7 = 0xffff;
      if (0xffff < (int)uVar6) {
        uVar7 = uVar6;
      }
      do {
        uVar5 = uVar6 + 1;
        uVar8 = uVar7;
        if (uVar5 - uVar7 == 1) break;
        if (*(int *)this <= (int)uVar5 >> 5) goto LAB_00140b02;
        uVar8 = uVar6;
        uVar6 = uVar5;
      } while ((*(uint *)(*(long *)(this + 8) + (long)((int)uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1)
               != 0);
      iVar4 = out_ranges->Capacity;
      if (iVar1 == iVar4) {
        if (iVar4 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar4 / 2 + iVar4;
        }
        iVar3 = iVar3 + 2;
        if (iVar3 < iVar1) {
          iVar3 = iVar1;
        }
        if (iVar4 < iVar3) {
          puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar3 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar2;
          out_ranges->Capacity = iVar3;
        }
      }
      out_ranges->Data[out_ranges->Size] = (unsigned_short)uVar8;
      out_ranges->Size = out_ranges->Size + 1;
    }
    uVar6 = uVar8 + 1;
    if (0xfffe < (int)uVar8) {
      iVar1 = out_ranges->Capacity;
      if (out_ranges->Size == iVar1) {
        iVar3 = out_ranges->Size + 1;
        if (iVar1 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar1 / 2 + iVar1;
        }
        if (iVar3 < iVar4) {
          iVar3 = iVar4;
        }
        if (iVar1 < iVar3) {
          puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar3 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar2;
          out_ranges->Capacity = iVar3;
        }
      }
      out_ranges->Data[out_ranges->Size] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    int max_codepoint = 0x10000;
    for (int n = 0; n < max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint - 1 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}